

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

void __thiscall fasttext::FastText::analogies(FastText *this,int32_t k)

{
  bool bVar1;
  int32_t iVar2;
  element_type *this_00;
  ostream *this_01;
  Matrix *in_RDI;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar3;
  pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pair;
  iterator __end2;
  iterator __begin2;
  vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range2;
  vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  results;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  banSet;
  Matrix wordVectors;
  Vector query;
  Vector buffer;
  string word;
  vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffe68;
  __normal_iterator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *in_stack_fffffffffffffe70;
  ostream *in_stack_fffffffffffffe80;
  undefined7 in_stack_fffffffffffffe88;
  undefined1 in_stack_fffffffffffffe8f;
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffe90;
  undefined7 in_stack_fffffffffffffe98;
  undefined1 in_stack_fffffffffffffe9f;
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffec0;
  FastText *in_stack_fffffffffffffed0;
  __normal_iterator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_120;
  undefined1 *local_118;
  _Base_ptr local_110;
  undefined1 local_108;
  _Base_ptr local_100;
  undefined1 local_f8;
  _Base_ptr local_f0;
  undefined1 local_e8;
  undefined1 local_e0 [152];
  vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffffb8;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffc0;
  int32_t in_stack_ffffffffffffffcc;
  Vector *in_stack_ffffffffffffffd0;
  Matrix *in_stack_ffffffffffffffd8;
  FastText *in_stack_ffffffffffffffe0;
  
  std::__cxx11::string::string((string *)&stack0xffffffffffffffd0);
  std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x16d76a);
  Vector::Vector((Vector *)in_stack_fffffffffffffea0._M_node,
                 CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
  std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x16d787);
  Vector::Vector((Vector *)in_stack_fffffffffffffea0._M_node,
                 CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
  this_00 = std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x16d7a8);
  iVar2 = Dictionary::nwords(this_00);
  std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x16d7cb);
  Matrix::Matrix((Matrix *)in_stack_fffffffffffffea0._M_node,
                 CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98),
                 (int64_t)in_stack_fffffffffffffe90._M_node);
  precomputeWordVectors(in_stack_fffffffffffffed0,in_RDI);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x16d804);
  std::operator<<((ostream *)&std::cout,"Query triplet (A - B + C)? ");
  std::
  vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector((vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)0x16d826);
  do {
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)0x16d835);
    Vector::zero((Vector *)in_stack_fffffffffffffe80);
    std::operator>>((istream *)&std::cin,(string *)&stack0xffffffffffffffd0);
    pVar3 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffffe90._M_node,
                     (value_type *)CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88));
    local_f0 = (_Base_ptr)pVar3.first._M_node;
    local_e8 = pVar3.second;
    getWordVector(in_stack_fffffffffffffed0,(Vector *)in_RDI,
                  (string *)CONCAT44(iVar2,in_stack_fffffffffffffec0));
    Vector::addVector((Vector *)in_stack_fffffffffffffea0._M_node,
                      (Vector *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98),
                      (real)((ulong)in_stack_fffffffffffffe90._M_node >> 0x20));
    std::operator>>((istream *)&std::cin,(string *)&stack0xffffffffffffffd0);
    pVar3 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffffe90._M_node,
                     (value_type *)CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88));
    in_stack_fffffffffffffea0 = pVar3.first._M_node;
    in_stack_fffffffffffffe9f = pVar3.second;
    local_100 = in_stack_fffffffffffffea0._M_node;
    local_f8 = in_stack_fffffffffffffe9f;
    getWordVector(in_stack_fffffffffffffed0,(Vector *)in_RDI,
                  (string *)CONCAT44(iVar2,in_stack_fffffffffffffec0));
    Vector::addVector((Vector *)in_stack_fffffffffffffea0._M_node,
                      (Vector *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98),
                      (real)((ulong)in_stack_fffffffffffffe90._M_node >> 0x20));
    std::operator>>((istream *)&std::cin,(string *)&stack0xffffffffffffffd0);
    pVar3 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffffe90._M_node,
                     (value_type *)CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88));
    in_stack_fffffffffffffe90 = pVar3.first._M_node;
    in_stack_fffffffffffffe8f = pVar3.second;
    local_110 = in_stack_fffffffffffffe90._M_node;
    local_108 = in_stack_fffffffffffffe8f;
    getWordVector(in_stack_fffffffffffffed0,(Vector *)in_RDI,
                  (string *)CONCAT44(iVar2,in_stack_fffffffffffffec0));
    Vector::addVector((Vector *)in_stack_fffffffffffffea0._M_node,
                      (Vector *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98),
                      (real)((ulong)in_stack_fffffffffffffe90._M_node >> 0x20));
    findNN(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
           in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    local_118 = local_e0;
    local_120._M_current =
         (pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)std::
            vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::begin(in_stack_fffffffffffffe68);
    std::
    vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::end(in_stack_fffffffffffffe68);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (in_stack_fffffffffffffe70,
                         (__normal_iterator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          *)in_stack_fffffffffffffe68);
      if (!bVar1) break;
      in_stack_fffffffffffffed0 =
           (FastText *)
           __gnu_cxx::
           __normal_iterator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::operator*(&local_120);
      in_stack_fffffffffffffe80 =
           std::operator<<((ostream *)&std::cout,
                           (string *)
                           &(in_stack_fffffffffffffed0->args_).
                            super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
      this_01 = std::operator<<(in_stack_fffffffffffffe80," ");
      in_stack_fffffffffffffe70 =
           (__normal_iterator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            *)std::ostream::operator<<
                        (this_01,*(float *)&(in_stack_fffffffffffffed0->args_).
                                            super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_ptr);
      std::ostream::operator<<(in_stack_fffffffffffffe70,std::endl<char,std::char_traits<char>>);
      __gnu_cxx::
      __normal_iterator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::operator++(&local_120);
    }
    std::operator<<((ostream *)&std::cout,"Query triplet (A - B + C)? ");
  } while( true );
}

Assistant:

void FastText::analogies(int32_t k) {
  std::string word;
  Vector buffer(args_->dim), query(args_->dim);
  Matrix wordVectors(dict_->nwords(), args_->dim);
  precomputeWordVectors(wordVectors);
  std::set<std::string> banSet;
  std::cout << "Query triplet (A - B + C)? ";
  std::vector<std::pair<real, std::string>> results;
  while (true) {
    banSet.clear();
    query.zero();
    std::cin >> word;
    banSet.insert(word);
    getWordVector(buffer, word);
    query.addVector(buffer, 1.0);
    std::cin >> word;
    banSet.insert(word);
    getWordVector(buffer, word);
    query.addVector(buffer, -1.0);
    std::cin >> word;
    banSet.insert(word);
    getWordVector(buffer, word);
    query.addVector(buffer, 1.0);

    findNN(wordVectors, query, k, banSet, results);
    for (auto& pair : results) {
      std::cout << pair.second << " " << pair.first << std::endl;
    }
    std::cout << "Query triplet (A - B + C)? ";
  }
}